

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O2

void mat_inf_norm_rows(csc *M,c_float *E)

{
  long *plVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  
  lVar5 = 0;
  lVar4 = M->m;
  if (M->m < 1) {
    lVar4 = lVar5;
  }
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    E[lVar5] = 0.0;
  }
  lVar5 = 0;
  lVar4 = M->n;
  if (M->n < 1) {
    lVar4 = lVar5;
  }
  while (lVar5 != lVar4) {
    plVar1 = M->p + lVar5;
    lVar3 = M->p[lVar5 + 1];
    lVar5 = lVar5 + 1;
    for (lVar6 = *plVar1; lVar6 < lVar3; lVar6 = lVar6 + 1) {
      dVar2 = M->x[lVar6];
      dVar7 = -dVar2;
      if (-dVar2 <= dVar2) {
        dVar7 = dVar2;
      }
      if (dVar7 <= E[M->i[lVar6]]) {
        dVar7 = E[M->i[lVar6]];
      }
      E[M->i[lVar6]] = dVar7;
    }
  }
  return;
}

Assistant:

void mat_inf_norm_rows(const csc *M, c_float *E) {
  c_int i, j, ptr;

  // Initialize zero max elements
  for (j = 0; j < M->m; j++) {
    E[j] = 0.;
  }

  // Compute maximum across rows
  for (j = 0; j < M->n; j++) {
    for (ptr = M->p[j]; ptr < M->p[j + 1]; ptr++) {
      i    = M->i[ptr];
      E[i] = c_max(c_absval(M->x[ptr]), E[i]);
    }
  }
}